

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O0

void duckdb::BinaryExecutor::
     ExecuteConstant<int,int,bool,duckdb::BinarySingleArgumentOperatorWrapper,duckdb::NotEquals,bool>
               (Vector *left,Vector *right,Vector *result,bool fun)

{
  bool bVar1;
  int *piVar2;
  int *piVar3;
  bool *pbVar4;
  undefined1 in_CL;
  Vector *in_RDX;
  Vector *in_RSI;
  bool in_stack_0000000f;
  bool *result_data;
  int *rdata;
  int *ldata;
  undefined4 in_stack_ffffffffffffffb8;
  int iVar5;
  int iVar6;
  undefined4 in_stack_ffffffffffffffc4;
  uint uVar7;
  
  Vector::SetVectorType(in_RSI,(VectorType)((ulong)in_RDX >> 0x38));
  piVar2 = ConstantVector::GetData<int>((Vector *)0x4fef94);
  piVar3 = ConstantVector::GetData<int>((Vector *)0x4fefa3);
  pbVar4 = ConstantVector::GetData<bool>((Vector *)0x4fefb2);
  bVar1 = ConstantVector::IsNull((Vector *)0x4fefc1);
  if ((!bVar1) && (bVar1 = ConstantVector::IsNull((Vector *)0x4fefcf), !bVar1)) {
    uVar7 = CONCAT13(in_CL,(int3)in_stack_ffffffffffffffc4) & 0x1ffffff;
    iVar5 = *piVar2;
    iVar6 = *piVar3;
    ConstantVector::Validity(in_RDX);
    bVar1 = BinarySingleArgumentOperatorWrapper::Operation<bool,duckdb::NotEquals,int,int,bool>
                      (SUB81((ulong)piVar3 >> 0x38,0),(int)piVar3,(int)((ulong)pbVar4 >> 0x20),
                       (ValidityMask *)CONCAT44(uVar7,iVar6),
                       CONCAT44(iVar5,in_stack_ffffffffffffffb8));
    *pbVar4 = bVar1;
    return;
  }
  ConstantVector::SetNull((Vector *)result_data,in_stack_0000000f);
  return;
}

Assistant:

static void ExecuteConstant(Vector &left, Vector &right, Vector &result, FUNC fun) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);

		auto ldata = ConstantVector::GetData<LEFT_TYPE>(left);
		auto rdata = ConstantVector::GetData<RIGHT_TYPE>(right);
		auto result_data = ConstantVector::GetData<RESULT_TYPE>(result);

		if (ConstantVector::IsNull(left) || ConstantVector::IsNull(right)) {
			ConstantVector::SetNull(result, true);
			return;
		}
		*result_data = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
		    fun, *ldata, *rdata, ConstantVector::Validity(result), 0);
	}